

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O3

int cmOutputConverter::Shell__CharNeedsQuotes(char c,int flags)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = 0;
  if ((flags & 0x104U) != 4) {
    iVar3 = (int)c;
    iVar2 = 1;
    if ((iVar3 != 9) && (iVar3 != 0x20)) {
      uVar1 = iVar3 - 0x23;
      if (((uint)flags >> 8 & 1) == 0) {
        if (((0x3b < uVar1) || ((0x80000000a000019U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) &&
           (iVar3 != 0x7c)) {
          return 0;
        }
      }
      else if ((((0x3d < uVar1) || ((0x2a0000000b0000fbU >> ((ulong)uVar1 & 0x3f) & 1) == 0)) &&
               (iVar3 != 0x7c)) && (iVar3 != 0x7e)) {
        return 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int cmOutputConverter::Shell__CharNeedsQuotes(char c, int flags)
{
  /* On Windows the built-in command shell echo never needs quotes.  */
  if (!(flags & Shell_Flag_IsUnix) && (flags & Shell_Flag_EchoWindows)) {
    return 0;
  }

  /* On all platforms quotes are needed to preserve whitespace.  */
  if (Shell__CharIsWhitespace(c)) {
    return 1;
  }

  if (flags & Shell_Flag_IsUnix) {
    /* On UNIX several special characters need quotes to preserve them.  */
    if (Shell__CharNeedsQuotesOnUnix(c)) {
      return 1;
    }
  } else {
    /* On Windows several special characters need quotes to preserve them.  */
    if (Shell__CharNeedsQuotesOnWindows(c)) {
      return 1;
    }
  }
  return 0;
}